

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

void __thiscall orphanage_tests::get_children::test_method(get_children *this)

{
  _Rb_tree_header *this_00;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint256 *puVar5;
  bool bVar6;
  readonly_property<bool> rVar7;
  iterator in_R8;
  iterator pvVar8;
  allocator_type *__a;
  assertion_result *paVar9;
  iterator in_R9;
  iterator pvVar10;
  long lVar11;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  const_string file_17;
  const_string file_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  const_string file_19;
  const_string file_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  const_string file_21;
  const_string file_22;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_08;
  const_string file_23;
  const_string file_24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  check_type cVar12;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  _Base_ptr local_390;
  undefined1 local_388 [24];
  assertion_result local_370;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  CTransactionRef child_p1n0_p2n0;
  CTransactionRef child_p1n0_p1n1;
  CTransactionRef child_p2n1;
  CTransactionRef child_p1n0;
  CTransactionRef parent2;
  CTransactionRef parent1;
  vector<COutPoint,_std::allocator<COutPoint>_> empty_outpoints;
  undefined1 local_1f8 [24];
  _Base_ptr local_1e0;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_parent2_children;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_parent1_children;
  TxOrphanage orphanage;
  FastRandomContext det_rand;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&det_rand,true);
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MakeTransactionSpending((orphanage_tests *)&parent1,&empty_outpoints,&det_rand);
  MakeTransactionSpending((orphanage_tests *)&parent2,&empty_outpoints,&det_rand);
  this_00 = &orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    bVar6 = transaction_identifier<false>::operator==
                      (&(parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash,
                       &(parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash);
    if (!bVar6) break;
    MakeTransactionSpending((orphanage_tests *)&orphanage,&empty_outpoints,&det_rand);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&orphanage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  puVar5 = &((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  orphanage.m_orphans._M_t._M_impl._0_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[0];
  orphanage.m_orphans._M_t._M_impl._1_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[1];
  orphanage.m_orphans._M_t._M_impl._2_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[2];
  orphanage.m_orphans._M_t._M_impl._3_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[3];
  orphanage.m_orphans._M_t._M_impl._4_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[4];
  orphanage.m_orphans._M_t._M_impl._5_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[5];
  orphanage.m_orphans._M_t._M_impl._6_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[6];
  orphanage.m_orphans._M_t._M_impl._7_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[7];
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&orphanage;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,__l,
             (allocator_type *)&expected_parent2_children);
  MakeTransactionSpending
            ((orphanage_tests *)&child_p1n0,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,&det_rand);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children);
  puVar5 = &((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  orphanage.m_orphans._M_t._M_impl._0_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[0];
  orphanage.m_orphans._M_t._M_impl._1_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[1];
  orphanage.m_orphans._M_t._M_impl._2_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[2];
  orphanage.m_orphans._M_t._M_impl._3_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[3];
  orphanage.m_orphans._M_t._M_impl._4_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[4];
  orphanage.m_orphans._M_t._M_impl._5_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[5];
  orphanage.m_orphans._M_t._M_impl._6_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[6];
  orphanage.m_orphans._M_t._M_impl._7_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[7];
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&orphanage;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,__l_00,
             (allocator_type *)&expected_parent2_children);
  MakeTransactionSpending
            ((orphanage_tests *)&child_p2n1,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,&det_rand);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children);
  puVar5 = &((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  orphanage.m_orphans._M_t._M_impl._0_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[0];
  orphanage.m_orphans._M_t._M_impl._1_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[1];
  orphanage.m_orphans._M_t._M_impl._2_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[2];
  orphanage.m_orphans._M_t._M_impl._3_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[3];
  orphanage.m_orphans._M_t._M_impl._4_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[4];
  orphanage.m_orphans._M_t._M_impl._5_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[5];
  orphanage.m_orphans._M_t._M_impl._6_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[6];
  orphanage.m_orphans._M_t._M_impl._7_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[7];
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  uVar2 = *(undefined8 *)
           ((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)
           (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_peer_work_set._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar4 = *(undefined8 *)
           (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar2;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar2 >> 0x20);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (undefined4)uVar3;
  orphanage.m_peer_work_set._M_t._M_impl._0_4_ = SUB84((ulong)uVar3 >> 0x20,0);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar4,0);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar4 >> 0x20);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 1;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&orphanage;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,__l_01,
             (allocator_type *)&expected_parent2_children);
  MakeTransactionSpending
            ((orphanage_tests *)&child_p1n0_p1n1,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,&det_rand);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children);
  puVar5 = &((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  orphanage.m_orphans._M_t._M_impl._0_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[0];
  orphanage.m_orphans._M_t._M_impl._1_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[1];
  orphanage.m_orphans._M_t._M_impl._2_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[2];
  orphanage.m_orphans._M_t._M_impl._3_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[3];
  orphanage.m_orphans._M_t._M_impl._4_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[4];
  orphanage.m_orphans._M_t._M_impl._5_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[5];
  orphanage.m_orphans._M_t._M_impl._6_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[6];
  orphanage.m_orphans._M_t._M_impl._7_1_ = (puVar5->super_base_blob<256U>).m_data._M_elems[7];
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  uVar2 = *(undefined8 *)
           ((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)
           (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  orphanage.m_peer_work_set._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
         .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar4 = *(undefined8 *)
           (((parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar2;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar2 >> 0x20);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (undefined4)uVar3;
  orphanage.m_peer_work_set._M_t._M_impl._0_4_ = SUB84((ulong)uVar3 >> 0x20,0);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar4,0);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar4 >> 0x20);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&orphanage;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,__l_02,
             (allocator_type *)&expected_parent2_children);
  MakeTransactionSpending
            ((orphanage_tests *)&child_p1n0_p2n0,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children,&det_rand);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&expected_parent1_children);
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl._4_8_ =
       orphanage.m_peer_work_set._M_t._M_impl._4_8_ & 0xffffffff;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.m_next_sweep.__d.__r = (duration)0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12e;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  bVar6 = TxOrphanage::AddTx(&orphanage,&child_p1n0,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  expected_parent2_children._M_t._M_impl._0_1_ = bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_2a8,0x12e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12f;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
             msg_00);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p2n1,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p2n1, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2d0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_2d8,0x12f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x130;
  file_01.m_begin = (iterator)&local_2e8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
             msg_01);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p1n0_p1n1,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p1n1, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_300 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_308,0x130);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_318;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_328,
             msg_02);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p1n0_p2n0,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p2n0, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_330 = "";
  pvVar8 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_338,0x131);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children,
             &child_p1n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             &child_p1n0_p2n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             &child_p1n0_p1n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&expected_parent2_children;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent1_children,__l_03,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)&local_370);
  lVar11 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (&expected_parent2_children._M_t._M_impl.field_0x0 + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -8);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_1f8,
             &child_p2n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 0x10),
             &child_p1n0_p2n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __a = (allocator_type *)local_388;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1f8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent2_children,__l_04,(less<std::shared_ptr<const_CTransaction>_> *)&local_370,
        __a);
  lVar11 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -8);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x136;
  file_03.m_begin = (iterator)&local_348;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
             msg_03);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&parent1,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns(&expected_parent1_children,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = 
  "EqualTxns(expected_parent1_children, orphanage.GetChildrenFromSamePeer(parent1, node1))";
  local_390 = (_Base_ptr)0xbcbb79;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_3a8,0x136);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x137;
  file_04.m_begin = (iterator)&local_3b8;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c8,
             msg_04);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&parent2,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns(&expected_parent2_children,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = 
  "EqualTxns(expected_parent2_children, orphanage.GetChildrenFromSamePeer(parent2, node1))";
  local_390 = (_Base_ptr)0xbcbbd1;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3d0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_3d8,0x137);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x139;
  file_05.m_begin = (iterator)&local_3e8;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
             msg_05);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,&orphanage,&parent1,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns(&expected_parent1_children,
                 (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = 
  "EqualTxns(expected_parent1_children, orphanage.GetChildrenFromDifferentPeer(parent1, node2))";
  local_390 = (_Base_ptr)0xbcbc2e;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_400 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_408,0x139);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x13a;
  file_06.m_begin = (iterator)&local_418;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
             msg_06);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,&orphanage,&parent2,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns(&expected_parent2_children,
                 (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = 
  "EqualTxns(expected_parent2_children, orphanage.GetChildrenFromDifferentPeer(parent2, node2))";
  local_390 = (_Base_ptr)0xbcbc8b;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_430 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_438,0x13a);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x13d;
  file_07.m_begin = (iterator)&local_448;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_458,
             msg_07);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&parent1,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromSamePeer(parent1, node2).empty()";
  local_390 = (_Base_ptr)0xbcbcc5;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_460 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_468,0x13d);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x13e;
  file_08.m_begin = (iterator)&local_478;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_488,
             msg_08);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&parent2,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromSamePeer(parent2, node2).empty()";
  local_390 = (_Base_ptr)0xbcbcff;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_490 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_498,0x13e);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x141;
  file_09.m_begin = (iterator)&local_4a8;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4b8,
             msg_09);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&child_p1n0_p2n0,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node1).empty()";
  local_390 = (_Base_ptr)0xbcbd41;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4c0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_4c8,0x141);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x142;
  file_10.m_begin = (iterator)&local_4d8;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4e8,
             msg_10);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,&orphanage,&child_p1n0_p2n0,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node2).empty()";
  local_390 = (_Base_ptr)0xbcbd83;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_4f8,0x142);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x143;
  file_11.m_begin = (iterator)&local_508;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_518,
             msg_11);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,&orphanage,&child_p1n0_p2n0,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node1).empty()";
  local_390 = (_Base_ptr)0xbcbdca;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_520 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_528,0x143);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x144;
  file_12.m_begin = (iterator)&local_538;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_548,
             msg_12);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,&orphanage,&child_p1n0_p2n0,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398 = "orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node2).empty()";
  local_390 = (_Base_ptr)0xbcbe11;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_550 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_1e0 = (_Base_ptr)&local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar12,(size_t)&local_558,0x144);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent2_children._M_t);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent1_children._M_t);
  TxOrphanage::~TxOrphanage(&orphanage);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl._4_8_ =
       orphanage.m_peer_work_set._M_t._M_impl._4_8_ & 0xffffffff;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.m_next_sweep.__d.__r = (duration)0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x14a;
  file_13.m_begin = (iterator)&local_568;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar8;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_578,
             msg_13);
  bVar6 = TxOrphanage::AddTx(&orphanage,&child_p1n0,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_580 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  expected_parent2_children._M_t._M_impl._0_1_ = bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_588,0x14a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x14b;
  file_14.m_begin = (iterator)&local_598;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5a8,
             msg_14);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p2n1,1);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p2n1, node1)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5b0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_5b8,0x14b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x14c;
  file_15.m_begin = (iterator)&local_5c8;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5d8,
             msg_15);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p1n0_p1n1,2);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p1n1, node2)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5e0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_5e8,0x14c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x14d;
  file_16.m_begin = (iterator)&local_5f8;
  msg_16.m_end = pvVar10;
  msg_16.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_608,
             msg_16);
  expected_parent2_children._M_t._M_impl._0_1_ = TxOrphanage::AddTx(&orphanage,&child_p1n0_p2n0,2);
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p2n0, node2)";
  local_1f8._8_8_ = "";
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  expected_parent1_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_610 = "";
  pvVar8 = (iterator)0x0;
  expected_parent1_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_parent2_children,
             (lazy_ostream *)&expected_parent1_children,1,0,WARN,_cVar12,(size_t)&local_618,0x14d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children,
             &child_p1n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  paVar9 = &local_370;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&expected_parent2_children;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent1_children,__l_05,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header);
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x15a;
  file_17.m_begin = (iterator)&local_628;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = (iterator)paVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_638,
             msg_17);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,&orphanage,&parent1,1);
  rVar7.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns(&expected_parent1_children,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromSamePeer(parent1, node1))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_640 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  local_1f8[0] = rVar7.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_648,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x15b;
  file_18.m_begin = (iterator)&local_658;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_668,
             msg_18);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,&orphanage,&parent1,2);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromDifferentPeer(parent1, node2))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_670 = "";
  pvVar8 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_678,0x15b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent1_children._M_t);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children,
             &child_p2n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  paVar9 = &local_370;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&expected_parent2_children;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent1_children,__l_06,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x162;
  file_19.m_begin = (iterator)&local_688;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = (iterator)paVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_698,
             msg_19);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,&orphanage,&parent2,1);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromSamePeer(parent2, node1))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_6a8,0x162);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x163;
  file_20.m_begin = (iterator)&local_6b8;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6c8,
             msg_20);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,&orphanage,&parent2,2);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromDifferentPeer(parent2, node2))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6d0 = "";
  pvVar8 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_6d8,0x163);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent1_children._M_t);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children,
             &child_p1n0_p1n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             &child_p1n0_p2n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  paVar9 = &local_370;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&expected_parent2_children;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent1_children,__l_07,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar9);
  lVar11 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (&expected_parent2_children._M_t._M_impl.field_0x0 + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -8);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x16a;
  file_21.m_begin = (iterator)&local_6e8;
  msg_21.m_end = pvVar8;
  msg_21.m_begin = (iterator)paVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6f8,
             msg_21);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,&orphanage,&parent1,2);
  rVar7.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns(&expected_parent1_children,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromSamePeer(parent1, node2))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_700 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  local_1f8[0] = rVar7.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_708,0x16a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x16b;
  file_22.m_begin = (iterator)&local_718;
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_728,
             msg_22);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,&orphanage,&parent1,1);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromDifferentPeer(parent1, node1))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_730 = "";
  pvVar8 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_738,0x16b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent1_children._M_t);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children,
             &child_p1n0_p2n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  paVar9 = &local_370;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&expected_parent2_children;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_parent1_children,__l_08,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &expected_parent2_children._M_t._M_impl.super__Rb_tree_header);
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x172;
  file_23.m_begin = (iterator)&local_748;
  msg_23.m_end = pvVar8;
  msg_23.m_begin = (iterator)paVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_758,
             msg_23);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,&orphanage,&parent2,2);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromSamePeer(parent2, node2))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_760 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_768,0x172);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x173;
  file_24.m_begin = (iterator)&local_778;
  msg_24.m_end = pvVar10;
  msg_24.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_788,
             msg_24);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,&orphanage,&parent2,1);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns(&expected_parent1_children,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  local_1f8._8_8_ = (_Base_ptr)0x0;
  local_1f8._16_8_ = (_Base_ptr)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromDifferentPeer(parent2, node1))";
  local_388._8_8_ = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  expected_parent2_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_790 = "";
  expected_parent2_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&expected_parent2_children,1,0,WARN,
             _cVar12,(size_t)&local_798,0x173);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_parent1_children._M_t);
  TxOrphanage::~TxOrphanage(&orphanage);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_p1n0_p2n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_p1n0_p1n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_p2n1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_p1n0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            (&empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
  ChaCha20::~ChaCha20(&det_rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_children)
{
    FastRandomContext det_rand{true};
    std::vector<COutPoint> empty_outpoints;

    auto parent1 = MakeTransactionSpending(empty_outpoints, det_rand);
    auto parent2 = MakeTransactionSpending(empty_outpoints, det_rand);

    // Make sure these parents have different txids otherwise this test won't make sense.
    while (parent1->GetHash() == parent2->GetHash()) {
        parent2 = MakeTransactionSpending(empty_outpoints, det_rand);
    }

    // Create children to go into orphanage.
    auto child_p1n0 = MakeTransactionSpending({{parent1->GetHash(), 0}}, det_rand);
    auto child_p2n1 = MakeTransactionSpending({{parent2->GetHash(), 1}}, det_rand);
    // Spends the same tx twice. Should not cause duplicates.
    auto child_p1n0_p1n1 = MakeTransactionSpending({{parent1->GetHash(), 0}, {parent1->GetHash(), 1}}, det_rand);
    // Spends the same outpoint as previous tx. Should still be returned; don't assume outpoints are unique.
    auto child_p1n0_p2n0 = MakeTransactionSpending({{parent1->GetHash(), 0}, {parent2->GetHash(), 0}}, det_rand);

    const NodeId node1{1};
    const NodeId node2{2};

    // All orphans provided by node1
    {
        TxOrphanage orphanage;
        BOOST_CHECK(orphanage.AddTx(child_p1n0, node1));
        BOOST_CHECK(orphanage.AddTx(child_p2n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p1n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p2n0, node1));

        std::set<CTransactionRef> expected_parent1_children{child_p1n0, child_p1n0_p2n0, child_p1n0_p1n1};
        std::set<CTransactionRef> expected_parent2_children{child_p2n1, child_p1n0_p2n0};

        BOOST_CHECK(EqualTxns(expected_parent1_children, orphanage.GetChildrenFromSamePeer(parent1, node1)));
        BOOST_CHECK(EqualTxns(expected_parent2_children, orphanage.GetChildrenFromSamePeer(parent2, node1)));

        BOOST_CHECK(EqualTxns(expected_parent1_children, orphanage.GetChildrenFromDifferentPeer(parent1, node2)));
        BOOST_CHECK(EqualTxns(expected_parent2_children, orphanage.GetChildrenFromDifferentPeer(parent2, node2)));

        // The peer must match
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(parent1, node2).empty());
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(parent2, node2).empty());

        // There shouldn't be any children of this tx in the orphanage
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node1).empty());
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node2).empty());
        BOOST_CHECK(orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node1).empty());
        BOOST_CHECK(orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node2).empty());
    }

    // Orphans provided by node1 and node2
    {
        TxOrphanage orphanage;
        BOOST_CHECK(orphanage.AddTx(child_p1n0, node1));
        BOOST_CHECK(orphanage.AddTx(child_p2n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p1n1, node2));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p2n0, node2));

        // +----------------+---------------+----------------------------------+
        // |                | sender=node1  |           sender=node2           |
        // +----------------+---------------+----------------------------------+
        // | spends parent1 | child_p1n0    | child_p1n0_p1n1, child_p1n0_p2n0 |
        // | spends parent2 | child_p2n1    | child_p1n0_p2n0                  |
        // +----------------+---------------+----------------------------------+

        // Children of parent1 from node1:
        {
            std::set<CTransactionRef> expected_parent1_node1{child_p1n0};

            BOOST_CHECK(EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromSamePeer(parent1, node1)));
            BOOST_CHECK(EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromDifferentPeer(parent1, node2)));
        }

        // Children of parent2 from node1:
        {
            std::set<CTransactionRef> expected_parent2_node1{child_p2n1};

            BOOST_CHECK(EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromSamePeer(parent2, node1)));
            BOOST_CHECK(EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromDifferentPeer(parent2, node2)));
        }

        // Children of parent1 from node2:
        {
            std::set<CTransactionRef> expected_parent1_node2{child_p1n0_p1n1, child_p1n0_p2n0};

            BOOST_CHECK(EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromSamePeer(parent1, node2)));
            BOOST_CHECK(EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromDifferentPeer(parent1, node1)));
        }

        // Children of parent2 from node2:
        {
            std::set<CTransactionRef> expected_parent2_node2{child_p1n0_p2n0};

            BOOST_CHECK(EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromSamePeer(parent2, node2)));
            BOOST_CHECK(EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromDifferentPeer(parent2, node1)));
        }
    }
}